

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O3

string * __thiscall
chrono::ChEnumMapper<chrono::ChSolver::Type>::GetValueAsString_abi_cxx11_
          (string *__return_storage_ptr__,ChEnumMapper<chrono::ChSolver::Type> *this)

{
  element_type *peVar1;
  uint uVar2;
  pointer pCVar3;
  size_t sVar4;
  long lVar5;
  char buffer [10];
  char local_1a [10];
  
  peVar1 = (this->enummap).
           super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSolver::Type>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSolver::Type>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  pCVar3 = (peVar1->
           super__Vector_base<chrono::ChEnumNamePair<chrono::ChSolver::Type>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSolver::Type>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(peVar1->
                super__Vector_base<chrono::ChEnumNamePair<chrono::ChSolver::Type>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSolver::Type>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar3;
  if (lVar5 != 0) {
    lVar5 = (lVar5 >> 3) * -0x3333333333333333;
    lVar5 = lVar5 + (ulong)(lVar5 == 0);
    do {
      if (pCVar3->enumid == *this->value_ptr) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,*(long *)&pCVar3->name,
                   (pCVar3->name)._M_string_length + *(long *)&pCVar3->name);
        return __return_storage_ptr__;
      }
      pCVar3 = pCVar3 + 1;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  uVar2 = (**(this->super_ChEnumMapperBase)._vptr_ChEnumMapperBase)(this);
  sprintf(local_1a,"%d",(ulong)uVar2);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar4 = strlen(local_1a);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_1a,local_1a + sVar4);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string GetValueAsString() override {
        for (int i = 0; i < enummap->size(); ++i)
        {
            if(enummap->at(i).enumid == *value_ptr)
                return enummap->at(i).name;
        }
        // not found, just string as number:
        char buffer [10];
        sprintf(buffer, "%d", GetValueAsInt());
        return std::string(buffer);
    }